

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double empirical_discrete_pdf(double x,int a,double *b,double *c)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  
  if (-1 < a) {
    uVar2 = 0;
    do {
      if ((c[uVar2] == x) && (!NAN(c[uVar2]) && !NAN(x))) {
        dVar1 = b[uVar2];
        dVar3 = r8vec_sum(a,b);
        return dVar1 / dVar3;
      }
      uVar2 = uVar2 + 1;
    } while (a + 1 != uVar2);
  }
  return 0.0;
}

Assistant:

double empirical_discrete_pdf ( double x, int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_PDF evaluates the Empirical Discrete PDF.
//
//  Discussion:
//
//    A set of A values C(1:A) are assigned nonnegative weights B(1:A),
//    with at least one B nonzero.  The probability of C(I) is the
//    value of B(I) divided by the sum of the weights.
//
//    The C's must be distinct, and given in ascending order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_PDF, the value of the PDF.
//
{
  int i;
  double pdf;

  for ( i = 0; i <= a; i++ )
  {
    if ( x == c[i] )
    {
      pdf = b[i] / r8vec_sum ( a, b );
      return pdf;
    }
  }

  pdf = 0.0;

  return pdf;
}